

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::RandomUniformLikeLayerParams::SerializeWithCachedSizes
          (RandomUniformLikeLayerParams *this,CodedOutputStream *output)

{
  int64 iVar1;
  float fVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  RandomUniformLikeLayerParams *this_local;
  
  iVar1 = seed(this);
  if (iVar1 != 0) {
    iVar1 = seed(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(1,iVar1,output);
  }
  fVar2 = minval(this);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar2 = minval(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(2,fVar2,output);
  }
  fVar2 = maxval(this);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar2 = maxval(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(3,fVar2,output);
  }
  return;
}

Assistant:

void RandomUniformLikeLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.RandomUniformLikeLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 seed = 1;
  if (this->seed() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->seed(), output);
  }

  // float minVal = 2;
  if (this->minval() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->minval(), output);
  }

  // float maxVal = 3;
  if (this->maxval() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(3, this->maxval(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.RandomUniformLikeLayerParams)
}